

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONWorker.cpp
# Opt level: O0

char JSONWorker::Hex(char **pos)

{
  char cVar1;
  char *pcVar2;
  byte local_12;
  byte local_11;
  uchar lo;
  uchar hi;
  char **pos_local;
  
  pcVar2 = *pos;
  *pos = pcVar2 + 1;
  cVar1 = *pcVar2;
  local_11 = cVar1 - 0x30;
  if (local_11 < 0x31) {
    if (9 < local_11) {
      local_11 = cVar1 - 0x37;
    }
  }
  else {
    local_11 = cVar1 + 0xa9;
  }
  cVar1 = **pos;
  local_12 = cVar1 - 0x30;
  if (local_12 < 0x31) {
    if (9 < local_12) {
      local_12 = cVar1 - 0x37;
    }
  }
  else {
    local_12 = cVar1 + 0xa9;
  }
  return local_11 << 4 | local_12;
}

Assistant:

json_char JSONWorker::Hex(const json_char * & pos) json_nothrow {
    /*
	takes the numeric value of the next two characters and convert them
	\u0058 becomes 0x58

	In case of \u, it's SpecialChar's responsibility to move past the first two chars
	as this method is also used for \x
	*/
    //First character
    json_uchar hi = *pos++ - 48;
    if (hi > 48){  //A-F don't immediately follow 0-9, so have to pull them down a little
	   hi -= 39;
    } else if (hi > 9){  //neither do a-f
	   hi -= 7;
    }
    //second character
    json_uchar lo = *pos - 48;
    if (lo > 48){  //A-F don't immediately follow 0-9, so have to pull them down a little
	   lo -= 39;
    } else if (lo > 9){  //neither do a-f
	   lo -= 7;
    }
    //combine them
    return (json_char)((hi << 4) | lo);
}